

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O0

void __thiscall
KosarajuSCC::KosarajuSCC
          (KosarajuSCC *this,int v,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *out,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *in,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *en)

{
  value_type_conflict *in_RCX;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffff68;
  allocator_type *__a;
  undefined8 *__n;
  
  *in_RDI = &PTR__KosarajuSCC_0031d978;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  __a = (allocator_type *)(in_RDI + 2);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_RDX,in_stack_ffffffffffffff68);
  __n = in_RDI + 5;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_RDX,in_stack_ffffffffffffff68);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_RDX,in_stack_ffffffffffffff68);
  std::allocator<int>::allocator((allocator<int> *)0x2a1f5e);
  std::vector<int,_std::allocator<int>_>::vector(in_R8,(size_type)__n,in_RCX,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x2a1f83);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2a1f91);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x2a1fa2);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x2a1fb3);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x2a1fc4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2a1fd5);
  return;
}

Assistant:

KosarajuSCC::KosarajuSCC(int v, std::vector<std::vector<int> > out,
												 std::vector<std::vector<int> > in, std::vector<std::vector<int> > en)
		: nb_nodes(v),
			outgoing(std::move(out)),
			ingoing(std::move(in)),
			ends(std::move(en)),
			scc(nb_nodes, -1) {}